

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.c
# Opt level: O2

IceTImage icetDrawFrame(IceTDouble *projection_matrix,IceTDouble *modelview_matrix,
                       IceTFloat *background_color)

{
  double dVar1;
  byte bVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint *puVar9;
  IceTBoolean IVar10;
  int iVar11;
  uint uVar12;
  IceTSizeType IVar13;
  IceTSizeType IVar14;
  IceTEnum IVar15;
  IceTImage IVar16;
  IceTInt *pIVar17;
  ulong extraout_RAX;
  undefined7 extraout_var;
  ulong extraout_RAX_00;
  IceTDouble *pIVar18;
  IceTDouble *pIVar19;
  IceTBoolean *recvbuf;
  IceTBoolean *sendbuf;
  IceTUByte *pIVar20;
  IceTFloat *pIVar21;
  float *pfVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  int *piVar26;
  ulong uVar27;
  uint uVar28;
  IceTInt value;
  uint uVar29;
  int iVar30;
  int iVar31;
  ulong uVar32;
  int iVar33;
  long lVar34;
  uint uVar35;
  uint uVar36;
  IceTDouble *out;
  bool bVar37;
  double dVar38;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double dVar44;
  double dVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  double dVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double dVar52;
  double zfar;
  uint local_37c;
  undefined8 local_378;
  undefined8 uStack_370;
  uint *local_368;
  undefined4 local_35c;
  IceTInt num_tiles;
  uint local_354;
  uint local_350;
  uint local_34c;
  int *local_348;
  double dStack_340;
  IceTBoolean *local_338;
  uint local_32c;
  double local_328;
  double dStack_320;
  IceTInt global_viewport [4];
  undefined4 uStack_304;
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  IceTInt frame_count;
  IceTInt num_bounding_verts;
  IceTDouble buf_read_time;
  IceTDouble local_2c0;
  IceTDouble local_2b8;
  undefined8 local_2b0;
  IceTDouble render_time;
  double local_1c8;
  double dStack_1c0;
  IceTDouble total_time;
  IceTInt num_bounding_verts_1;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  double local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  double local_d8;
  double dStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  IceTDouble tmp_matrix [16];
  
  icetGetBooleanv(0x80,(IceTBoolean *)&render_time);
  if (render_time._0_1_ != '\0') {
    icetRaiseDiagnostic("Recursive frame draw detected.",0xfffffffb,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/draw.c"
                        ,0x30d);
    IVar16 = icetImageNull();
    return (IceTImage)IVar16.opaque_internals;
  }
  icetStateResetTiming();
  icetTimingDrawFrameBegin();
  icetStateSetDoublev(0x81,0x10,projection_matrix);
  icetStateSetDoublev(0x82,0x10,modelview_matrix);
  pIVar17 = icetUnsafeStateGetInteger(0x28);
  uVar29 = (int)((float)background_color[3] * 255.0) & 0xff;
  uVar28 = (int)((float)background_color[2] * 255.0) & 0xff;
  uVar35 = (int)((float)background_color[1] * 255.0) & 0xff;
  uVar36 = (int)((float)*background_color * 255.0) & 0xff;
  local_354 = uVar36;
  local_350 = uVar35;
  local_34c = uVar28;
  if (*pIVar17 == 0x302) {
    icetStateSetFloatv(5,4,black);
    icetStateSetInteger(6,0);
    icetGetIntegerv(0x1b,(IceTInt *)&render_time);
    uVar25 = extraout_RAX;
    if ((-1 < (int)render_time._0_4_) &&
       (uVar28 = local_350 << 8 | local_34c << 0x10 | uVar29 << 0x18 | local_354,
       uVar25 = (ulong)uVar28, uVar28 != 0)) {
      IVar10 = icetIsEnabled(0x143);
      uVar25 = CONCAT71(extraout_var,IVar10);
      if (IVar10 != '\0') {
        local_35c = 0;
        goto LAB_0010c315;
      }
    }
  }
  else {
    icetStateSetFloatv(5,4,background_color);
    icetStateSetInteger(6,uVar35 << 8 | uVar28 << 0x10 | uVar29 << 0x18 | uVar36);
    uVar25 = extraout_RAX_00;
  }
  local_35c = (undefined4)CONCAT71((int7)(uVar25 >> 8),1);
LAB_0010c315:
  icetGetIntegerv(0x2e,&frame_count);
  frame_count = frame_count + 1;
  icetStateSetIntegerv(0x2e,1,&frame_count);
  icetGetIntegerv(0x23,&num_bounding_verts);
  icetGetIntegerv(0x10,&num_tiles);
  local_368 = (uint *)icetGetStateBuffer(0x181,num_tiles << 2);
  local_338 = (IceTBoolean *)icetGetStateBuffer(0x182,num_tiles);
  local_32c = uVar29;
  if (num_bounding_verts < 1) {
    for (lVar34 = 0; lVar34 < num_tiles; lVar34 = lVar34 + 1) {
      local_368[lVar34] = (uint)lVar34;
      local_338[lVar34] = '\x01';
    }
    icetGetIntegerv(0x12,(IceTInt *)&local_378);
    buf_read_time = -1.0;
    total_time = 1.0;
    local_37c = num_tiles;
  }
  else {
    icetGetIntegerv(0x12,global_viewport);
    icetGetDoublev(0x81,&buf_read_time);
    icetGetDoublev(0x82,&total_time);
    local_120 = 0;
    uStack_118 = 0;
    local_130 = 0;
    uStack_128 = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    _num_bounding_verts_1 = (double)(int)global_viewport._8_8_;
    local_110 = (double)SUB84(global_viewport._8_8_,4);
    local_e8 = 0x4000000000000000;
    uStack_e0 = 0;
    local_d8 = (double)global_viewport[0] + (double)global_viewport[0] + _num_bounding_verts_1;
    dStack_d0 = (double)global_viewport[1] + (double)global_viewport[1] + local_110;
    local_c8 = 0;
    uStack_c0 = 0x4000000000000000;
    icetMatrixMultiply(tmp_matrix,&buf_read_time,&total_time);
    icetMatrixMultiply(&render_time,(IceTDouble *)&num_bounding_verts_1,tmp_matrix);
    icetGetIntegerv(0x23,&num_bounding_verts_1);
    pIVar18 = (IceTDouble *)icetGetStateBuffer(0x180,num_bounding_verts_1 << 5);
    pIVar19 = icetUnsafeStateGetDouble(0x22);
    pIVar19 = pIVar19 + 2;
    out = pIVar18;
    for (lVar34 = 0; puVar9 = local_368, lVar34 < num_bounding_verts_1; lVar34 = lVar34 + 1) {
      buf_read_time = pIVar19[-2];
      local_2c0 = pIVar19[-1];
      local_2b8 = *pIVar19;
      local_2b0 = 0x3ff0000000000000;
      icetMatrixVectorMultiply(out,&render_time,&buf_read_time);
      out = out + 4;
      pIVar19 = pIVar19 + 3;
    }
    local_1c8 = (double)((int)global_viewport._8_8_ + global_viewport[0]);
    dStack_1c0 = (double)(SUB84(global_viewport._8_8_,4) + global_viewport[1]);
    dVar38 = (double)global_viewport[1];
    buf_read_time = 1.0;
    total_time = -1.0;
    uVar25 = 0;
    uVar27 = 0;
    if (0 < num_bounding_verts_1) {
      uVar27 = (ulong)_num_bounding_verts_1 & 0xffffffff;
    }
    zfar = -1.0;
    dVar52 = 1.0;
    auVar40._8_4_ = SUB84(dVar38,0);
    auVar40._0_8_ = (double)global_viewport[0];
    auVar40._12_4_ = (int)((ulong)dVar38 >> 0x20);
    auVar51._8_8_ = dVar38;
    auVar51._0_8_ = (double)global_viewport[0];
    local_328 = local_1c8;
    dStack_320 = dStack_1c0;
    for (; uVar25 != uVar27; uVar25 = uVar25 + 1) {
      dVar38 = (double)pIVar18[uVar25 * 4 + 2];
      dVar45 = (double)pIVar18[uVar25 * 4 + 3];
      if (0.0 <= dVar38 + dVar45) {
        dVar45 = 1.0 / dVar45;
        dVar38 = dVar38 * dVar45;
        if (dVar38 < dVar52) {
          dVar52 = dVar38;
          buf_read_time = (IceTDouble)dVar38;
        }
        auVar48._0_8_ = dVar45 * (double)pIVar18[uVar25 * 4];
        auVar48._8_8_ = dVar45 * (double)(pIVar18 + uVar25 * 4)[1];
        auVar42._8_8_ = auVar48._8_8_;
        auVar42._0_8_ = auVar48._0_8_;
        auVar47._8_8_ = dStack_320;
        auVar47._0_8_ = local_328;
        auVar43 = minpd(auVar42,auVar47);
        auVar51 = maxpd(auVar48,auVar51);
        if (zfar < dVar38) {
          zfar = dVar38;
          total_time = (IceTDouble)dVar38;
        }
      }
      else {
        for (lVar34 = 0; ((ulong)_num_bounding_verts_1 & 0xffffffff) << 5 != lVar34;
            lVar34 = lVar34 + 0x20) {
          dVar1 = *(double *)((long)pIVar18 + lVar34 + 0x10);
          dVar49 = *(double *)((long)pIVar18 + lVar34 + 0x18);
          dVar44 = dVar1 + dVar49;
          if (0.0 <= dVar44) {
            dVar44 = dVar44 / (((dVar1 - dVar38) + dVar49) - dVar45);
            dVar49 = 1.0 / ((dVar45 - dVar49) * dVar44 + dVar49);
            dVar52 = *(double *)((long)pIVar18 + lVar34);
            dVar1 = ((double *)((long)pIVar18 + lVar34))[1];
            auVar50._0_8_ = dVar49 * (dVar44 * ((double)pIVar18[uVar25 * 4] - dVar52) + dVar52);
            auVar50._8_8_ = dVar49 * (dVar44 * ((double)(pIVar18 + uVar25 * 4)[1] - dVar1) + dVar1);
            auVar46._8_8_ = auVar50._8_8_;
            auVar46._0_8_ = auVar50._0_8_;
            auVar5._8_8_ = dStack_320;
            auVar5._0_8_ = local_328;
            auVar47 = minpd(auVar46,auVar5);
            auVar51 = maxpd(auVar50,auVar51);
            buf_read_time = -1.0;
            dVar52 = -1.0;
            local_328 = auVar47._0_8_;
            dStack_320 = auVar47._8_8_;
          }
        }
        auVar43._8_8_ = dStack_320;
        auVar43._0_8_ = local_328;
      }
      local_328 = auVar43._0_8_;
      dStack_320 = auVar43._8_8_;
    }
    if (dVar52 < -1.0) {
      buf_read_time = -1.0;
      dVar52 = -1.0;
    }
    if (1.0 < zfar) {
      total_time = 1.0;
      zfar = 1.0;
    }
    local_348 = (int *)ceil(auVar51._0_8_);
    uStack_304 = auVar51._4_4_;
    uStack_300 = auVar51._8_4_;
    uStack_2fc = auVar51._12_4_;
    auVar6._4_8_ = extraout_XMM0_Qb;
    auVar6._0_4_ = uStack_304;
    auVar39._0_8_ = auVar6._0_8_ << 0x20;
    auVar39._8_4_ = uStack_300;
    auVar39._12_4_ = uStack_2fc;
    dStack_340 = ceil(auVar39._8_8_);
    dVar38 = floor(local_328);
    dVar45 = floor(dStack_320);
    auVar4._8_4_ = SUB84(dVar45,0);
    auVar4._0_8_ = dVar38;
    auVar4._12_4_ = (int)((ulong)dVar45 >> 0x20);
    auVar51 = maxpd(auVar40,auVar4);
    auVar8._8_8_ = dStack_1c0;
    auVar8._0_8_ = local_1c8;
    auVar7._8_8_ = dStack_340;
    auVar7._0_8_ = local_348;
    auVar40 = minpd(auVar8,auVar7);
    uStack_370 = CONCAT44((int)(auVar40._8_8_ - auVar51._8_8_),(int)(auVar40._0_8_ - auVar51._0_8_))
    ;
    local_378 = CONCAT44((int)auVar51._8_8_,(int)auVar51._0_8_);
    drawDetermineContainedTiles
              ((IceTInt *)&local_378,(IceTDouble)dVar52,(IceTDouble)zfar,(IceTInt *)puVar9,local_338
               ,(IceTInt *)&local_37c);
  }
  iVar24 = 2;
  icetGetIntegerv(2,&num_bounding_verts_1);
  icetGetIntegerv(3,(IceTInt *)tmp_matrix);
  pIVar17 = icetUnsafeStateGetInteger(0x1a);
  icetGetIntegerv(0x2d,(IceTInt *)&render_time);
  if (1 < (int)render_time._0_4_) {
    local_348 = (int *)icetGetStateBuffer(0x183,tmp_matrix[0]._0_4_ << 2);
    icetGetIntegerv(0x2c,local_348);
    uVar28 = local_37c;
    uVar25 = (ulong)render_time._0_4_;
    if ((int)render_time._0_4_ < (int)local_37c) {
      while (IVar13 = (IceTSizeType)uVar25, iVar24 <= IVar13) {
        iVar30 = (int)uStack_370;
        iVar31 = uStack_370._4_4_;
        iVar11 = iVar24;
        do {
          iVar24 = iVar11;
          iVar11 = iVar24 + 1;
        } while (IVar13 % iVar24 != 0);
        lVar34 = (ulong)((int)uStack_370 < uStack_370._4_4_) * 4;
        iVar33 = *(int *)((long)&uStack_370 + (ulong)((int)uStack_370 < uStack_370._4_4_) * 4) /
                 iVar24;
        iVar11 = icetFindMyRankInGroup(local_348,IVar13);
        lVar3 = (long)(int)render_time._0_4_;
        render_time._0_4_ = (uint)(lVar3 / (long)iVar24);
        uVar25 = lVar3 / (long)iVar24 & 0xffffffff;
        iVar11 = iVar11 / (int)render_time._0_4_;
        iVar23 = iVar33 * iVar11;
        if (iVar11 + 2 == iVar24 + 1) {
          iVar33 = *(int *)((long)&uStack_370 + lVar34) - iVar23;
        }
        local_348 = local_348 + (int)(iVar11 * render_time._0_4_);
        *(int *)((long)&uStack_370 + lVar34) = iVar33;
        piVar26 = (int *)((long)&local_378 + (ulong)(iVar30 < iVar31) * 4);
        *piVar26 = *piVar26 + iVar23;
      }
      drawDetermineContainedTiles
                ((IceTInt *)&local_378,0.0,0.0,(IceTInt *)local_368,local_338,(IceTInt *)&local_37c)
      ;
    }
    else {
      lVar34 = (long)(int)local_37c;
      uVar29 = 0;
      local_328 = (double)CONCAT44(local_328._4_4_,local_37c);
      uVar25 = 0;
      if (0 < (int)local_37c) {
        uVar25 = (ulong)local_37c;
      }
      iVar24 = -1;
      uVar27 = 0;
      do {
        uVar32 = uVar27;
        if (uVar25 == uVar32) {
          uVar35 = 0xffffffff;
          iVar30 = local_328._0_4_;
          goto LAB_0010cf81;
        }
        uVar36 = local_368[uVar32];
        uVar12 = icetFindRankInGroup(local_348,render_time._0_4_,pIVar17[(int)uVar36]);
        uVar27 = uVar32 + 1;
      } while ((int)uVar12 < 0);
      bVar37 = local_348[uVar12] == num_bounding_verts_1;
      uVar29 = (uint)bVar37;
      uVar35 = 0xffffffff;
      if (bVar37) {
        uVar35 = uVar36;
      }
      iVar24 = -(uint)!bVar37;
      local_368[uVar32] = local_368[lVar34 + -1];
      lVar34 = (long)(int)render_time._0_4_;
      render_time._0_4_ = render_time._0_4_ - 1;
      local_348[uVar12] = local_348[lVar34 + -1];
      iVar30 = uVar28 - 1;
LAB_0010cf81:
      puVar9 = local_368;
      if (0 < iVar30) {
        uVar25 = (ulong)render_time._0_4_;
        if ((int)render_time._0_4_ < 1) {
          uVar25 = 0;
        }
        iVar11 = 0;
        iVar31 = 0;
        for (uVar27 = 0; uVar25 != uVar27; uVar27 = uVar27 + 1) {
          iVar23 = iVar31;
          if (iVar30 <= iVar31) {
            iVar23 = 0;
          }
          iVar33 = iVar11 + 1;
          iVar11 = iVar11 + (uint)(iVar30 <= iVar31);
          uVar29 = uVar29 + (uVar35 == local_368[iVar23]);
          if (local_348[uVar27] == num_bounding_verts_1) {
            uVar35 = local_368[iVar23];
            iVar24 = iVar11;
            uVar29 = iVar33 + (uint)(iVar30 <= iVar31);
          }
          iVar31 = iVar23 + 1;
        }
      }
      if ((int)uVar35 < 0) {
        local_37c = 0;
        local_378 = 0xffffd8f0ffffd8f0;
        uStack_370 = uStack_370 & 0xffffffff00000000;
        iVar30 = 0;
        piVar26 = (int *)((long)&uStack_370 + 4);
      }
      else {
        pIVar17 = icetUnsafeStateGetInteger(0x11);
        uVar25 = (ulong)(uVar35 * 4);
        iVar30 = pIVar17[uVar25 + 2] / (int)uVar29;
        local_37c = 1;
        *puVar9 = uVar35;
        uStack_370 = CONCAT44(pIVar17[uVar25 + 3],(int)uStack_370);
        local_378 = CONCAT44(pIVar17[uVar25 + 1],pIVar17[uVar25] + iVar30 * iVar24);
        if (iVar24 == uVar29 - 1) {
          iVar30 = pIVar17[uVar25 + 2] - iVar30 * iVar24;
        }
        piVar26 = (int *)&uStack_370;
      }
      *piVar26 = iVar30;
      icetGetIntegerv(0x10,global_viewport);
      uVar27 = 0;
      uVar25 = (ulong)(uint)global_viewport[0];
      if (global_viewport[0] < 1) {
        uVar25 = uVar27;
      }
      for (; uVar25 != uVar27; uVar27 = uVar27 + 1) {
        local_338[uVar27] = uVar35 == uVar27;
      }
    }
  }
  icetStateSetIntegerv(0x83,4,(IceTInt *)&local_378);
  icetStateSetDoublev(0x84,1,&buf_read_time);
  icetStateSetDoublev(0x85,1,&total_time);
  uVar28 = local_37c;
  icetStateSetInteger(0x86,local_37c);
  icetStateSetIntegerv(0x87,uVar28,(IceTInt *)local_368);
  icetStateSetBooleanv(0x88,num_tiles,local_338);
  icetGetEnumv(0x24,(IceTEnum *)&num_bounding_verts_1);
  uVar28 = local_32c;
  if (num_bounding_verts_1 != 0x6002) {
    icetGetIntegerv(3,(IceTInt *)&render_time);
    icetGetIntegerv(0x10,(IceTInt *)&buf_read_time);
    recvbuf = icetStateAllocateBoolean(0x89,render_time._0_4_ * buf_read_time._0_4_);
    sendbuf = icetUnsafeStateGetBoolean(0x88);
    icetCommAllgather(sendbuf,buf_read_time._0_4_,0x8001,recvbuf);
    pIVar17 = icetStateAllocateInteger(0x8a,buf_read_time._0_4_);
    total_time = (IceTDouble)((ulong)total_time & 0xffffffff00000000);
    iVar24 = 0;
    for (lVar34 = 0; lVar34 < (int)buf_read_time._0_4_; lVar34 = lVar34 + 1) {
      pIVar17[lVar34] = 0;
      iVar30 = 0;
      for (iVar31 = 0; iVar31 < (int)render_time._0_4_; iVar31 = iVar31 + 1) {
        if (recvbuf[(int)(buf_read_time._0_4_ * iVar31 + (int)lVar34)] != '\0') {
          iVar30 = iVar30 + 1;
          pIVar17[lVar34] = iVar30;
        }
      }
      iVar24 = iVar24 + iVar30;
      total_time = (IceTDouble)CONCAT44(total_time._4_4_,iVar24);
    }
    icetStateSetIntegerv(0x8b,1,(IceTInt *)&total_time);
  }
  icetGetIntegerv(0x1b,(IceTInt *)&render_time);
  if ((int)render_time._0_4_ < 0) {
    uVar29 = 0xffffffff;
    value = 0;
  }
  else {
    pIVar17 = icetUnsafeStateGetInteger(0x11);
    value = pIVar17[(int)(render_time._0_4_ * 4 | 3)] *
            pIVar17[(long)(int)render_time._0_4_ * 4 + 2];
    uVar29 = render_time._0_4_;
  }
  icetStateSetInteger(0x8c,uVar29);
  icetStateSetInteger(0x8d,0);
  icetStateSetInteger(0x8e,value);
  icetGetPointerv(0x60,(IceTVoid **)&render_time);
  if (CONCAT44(render_time._4_4_,render_time._0_4_) == 0) {
    icetRaiseDiagnostic("Drawing function not set.  Call icetDrawCallback.",0xfffffffb,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/draw.c"
                        ,0x2ad);
    IVar16 = icetImageNull();
  }
  else {
    icetStateSetBoolean(0x80,'\x01');
    icetGetEnumv(0x24,(IceTEnum *)&buf_read_time);
    IVar16 = icetInvokeStrategy(buf_read_time._0_4_);
    icetStateSetBoolean(0x80,'\0');
    icetGetIntegerv(0x8c,&num_bounding_verts_1);
    icetGetIntegerv(0x1b,(IceTInt *)&total_time);
    if (num_bounding_verts_1 != total_time._0_4_) {
      IVar10 = icetIsEnabled(0x146);
      if (IVar10 != '\0') {
        icetRaiseDiagnostic("Got unexpected tile from strategy.",0xffffffff,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/draw.c"
                            ,0x2bf);
      }
    }
    if (-1 < num_bounding_verts_1) {
      pIVar17 = icetUnsafeStateGetInteger(0x11);
      lVar34 = (long)num_bounding_verts_1;
      iVar24 = pIVar17[lVar34 * 4 + 2];
      IVar13 = icetImageGetWidth(IVar16);
      if ((iVar24 != IVar13) ||
         (iVar24 = pIVar17[lVar34 * 4 + 3], IVar13 = icetImageGetHeight(IVar16), iVar24 != IVar13))
      {
        icetGetIntegerv(0x8d,(IceTInt *)tmp_matrix);
        icetGetIntegerv(0x8e,global_viewport);
        icetRaiseDiagnostic("Got unexpected image size from strategy.",0xffffffff,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/draw.c"
                            ,0x2d2);
      }
    }
    icetStateCheckMemory();
  }
  if ((char)local_35c == '\0') {
    IVar13 = icetImageGetWidth(IVar16);
    IVar14 = icetImageGetHeight(IVar16);
    iVar24 = IVar14 * IVar13;
    IVar15 = icetImageGetColorFormat(IVar16);
    icetTimingBlendBegin();
    if (IVar15 == 0xc002) {
      pIVar21 = icetImageGetColorf(IVar16);
      iVar30 = 0;
      if (0 < iVar24) {
        iVar30 = iVar24;
      }
      pfVar22 = (float *)(pIVar21 + 3);
      while (bVar37 = iVar30 != 0, iVar30 = iVar30 + -1, bVar37) {
        fVar41 = 1.0 - *pfVar22;
        pfVar22[-3] = (float)*background_color * fVar41 + pfVar22[-3];
        pfVar22[-2] = (float)background_color[1] * fVar41 + pfVar22[-2];
        pfVar22[-1] = (float)background_color[2] * fVar41 + pfVar22[-1];
        *pfVar22 = fVar41 * (float)background_color[3] + *pfVar22;
        pfVar22 = pfVar22 + 4;
      }
    }
    else if (IVar15 == 0xc001) {
      pIVar20 = icetImageGetColorub(IVar16);
      if (iVar24 < 1) {
        iVar24 = 0;
      }
      for (lVar34 = 0; iVar24 != (int)lVar34; lVar34 = lVar34 + 1) {
        bVar2 = pIVar20[lVar34 * 4 + 3];
        uVar29 = bVar2 ^ 0xff;
        pIVar20[lVar34 * 4] = pIVar20[lVar34 * 4] + (char)((uVar29 * local_354 & 0xffff) / 0xff);
        pIVar20[lVar34 * 4 + 1] =
             pIVar20[lVar34 * 4 + 1] + (char)((uVar29 * local_350 & 0xffff) / 0xff);
        pIVar20[lVar34 * 4 + 2] =
             pIVar20[lVar34 * 4 + 2] + (char)((uVar29 * local_34c & 0xffff) / 0xff);
        pIVar20[lVar34 * 4 + 3] = (char)((ulong)(uVar29 * uVar28) / 0xff) + bVar2;
      }
    }
    else {
      icetRaiseDiagnostic("Encountered invalid color buffer type with color blending.",0xffffffff,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/draw.c"
                          ,0x2f3);
    }
    icetTimingBlendEnd();
  }
  icetGetDoublev(0xc1,&render_time);
  icetGetDoublev(0xc2,&buf_read_time);
  icetTimingDrawFrameEnd();
  icetGetDoublev(200,&total_time);
  icetStateSetDouble(0xc6,(IceTDouble)
                          (((double)total_time -
                           (double)CONCAT44(render_time._4_4_,render_time._0_4_)) -
                          (double)buf_read_time));
  icetStateSetDouble(0xc3,0.0);
  icetStateCheckMemory();
  return (IceTImage)IVar16.opaque_internals;
}

Assistant:

IceTImage icetDrawFrame(const IceTDouble *projection_matrix,
                        const IceTDouble *modelview_matrix,
                        const IceTFloat *background_color)
{
    IceTInt frame_count;
    IceTImage image;
    IceTDouble render_time;
    IceTDouble buf_read_time;
    IceTDouble compose_time;
    IceTDouble total_time;
    IceTUInt background_color_word;
    IceTBoolean need_color_correction;

    icetRaiseDebug("In icetDrawFrame");

    {
        IceTBoolean isDrawing;
        icetGetBooleanv(ICET_IS_DRAWING_FRAME, &isDrawing);
        if (isDrawing) {
            icetRaiseError("Recursive frame draw detected.",
                           ICET_INVALID_OPERATION);
            return icetImageNull();
        }
    }

    icetStateResetTiming();
    icetTimingDrawFrameBegin();

    icetStateSetDoublev(ICET_PROJECTION_MATRIX, 16, projection_matrix);
    icetStateSetDoublev(ICET_MODELVIEW_MATRIX, 16, modelview_matrix);

    drawUseBackgroundColor(background_color,
                           &background_color_word,
                           &need_color_correction);

    icetGetIntegerv(ICET_FRAME_COUNT, &frame_count);
    frame_count++;
    icetStateSetIntegerv(ICET_FRAME_COUNT, 1, &frame_count);

    drawProjectBounds();

    {
        IceTEnum strategy;
        icetGetEnumv(ICET_STRATEGY, &strategy);

        /* drawCollectTileInformation does an allgather to get information
         * about the tiles in other processes.  These variables are
         * ICET_ALL_CONTAINED_TILES_MASKS, ICET_TILE_CONTRIB_COUNTS, and
         * ICET_TOTAL_IMAGE_COUNT.  However, the sequential strategy ignores
         * this information and just uses all processes for all tiles.  When
         * compositing a single tile, this is a fine strategy and we can save
         * a significant proportion of frame time by skipping this step. */
        if (strategy != ICET_STRATEGY_SEQUENTIAL) {
            drawCollectTileInformation();
        }
    }

    {
        IceTInt tile_displayed;
        icetGetIntegerv(ICET_TILE_DISPLAYED, &tile_displayed);

        if (tile_displayed >= 0) {
            const IceTInt *tile_viewports
                = icetUnsafeStateGetInteger(ICET_TILE_VIEWPORTS);
            IceTInt num_pixels = (  tile_viewports[4*tile_displayed+2]
                                  * tile_viewports[4*tile_displayed+3] );
            icetStateSetInteger(ICET_VALID_PIXELS_TILE, tile_displayed);
            icetStateSetInteger(ICET_VALID_PIXELS_OFFSET, 0);
            icetStateSetInteger(ICET_VALID_PIXELS_NUM, num_pixels);
        } else {
            icetStateSetInteger(ICET_VALID_PIXELS_TILE, -1);
            icetStateSetInteger(ICET_VALID_PIXELS_OFFSET, 0);
            icetStateSetInteger(ICET_VALID_PIXELS_NUM, 0);
        }
    }

    image = drawInvokeStrategy();

    /* Correct background color where applicable. */
    if (need_color_correction) {
        drawCorrectBackground(image, background_color, background_color_word);
    }

    /* Calculate times. */
    icetGetDoublev(ICET_RENDER_TIME, &render_time);
    icetGetDoublev(ICET_BUFFER_READ_TIME, &buf_read_time);

    icetTimingDrawFrameEnd();

    icetGetDoublev(ICET_TOTAL_DRAW_TIME, &total_time);

    compose_time = total_time - render_time - buf_read_time;
    icetStateSetDouble(ICET_COMPOSITE_TIME, compose_time);

    icetStateSetDouble(ICET_BUFFER_WRITE_TIME, 0.0);

    icetStateCheckMemory();

    return image;
}